

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall
Lodtalk::ASTInterpreter::visitMessageSendNode(ASTInterpreter *this,MessageSendNode *node)

{
  pointer ppNVar1;
  InterpreterProxy *pIVar2;
  Node *pNVar3;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar4;
  pointer ppMVar5;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar6;
  Oop OVar7;
  uint uVar8;
  Node **arg;
  pointer ppNVar9;
  MessageSendNode *this_00;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  
  pNVar3 = AST::MessageSendNode::getReceiver(node);
  (*pNVar3->_vptr_Node[2])(pNVar3,this);
  pvVar4 = AST::MessageSendNode::getChainedMessages(node);
  ppMVar5 = (pvVar4->
            super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(pvVar4->
                     super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar5) >> 0x22 & 1) == 0)
  {
    uVar8 = 0xffffffff;
    do {
      this_00 = node;
      if (-1 < (int)uVar8) {
        this_00 = ppMVar5[uVar8];
      }
      if (uVar8 != 0xffffffff) {
        (*this->interpreter->_vptr_InterpreterProxy[6])();
      }
      uVar8 = uVar8 + 1;
      if (uVar8 != (uint)((ulong)((long)(pvVar4->
                                        super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar4->
                                       super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        (*this->interpreter->_vptr_InterpreterProxy[8])();
      }
      pvVar6 = AST::MessageSendNode::getArguments(this_00);
      ppNVar1 = (pvVar6->
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar9 = (pvVar6->
                     super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar1;
          ppNVar9 = ppNVar9 + 1) {
        (*(*ppNVar9)->_vptr_Node[2])(*ppNVar9,this);
      }
      pIVar2 = this->interpreter;
      OVar7 = AST::MessageSendNode::getSelectorOop(this_00);
      (*pIVar2->_vptr_InterpreterProxy[0x23])
                (pIVar2,OVar7.field_0,
                 (ulong)((long)(pvVar6->
                               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar6->
                              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppMVar5 = (pvVar4->
                super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while ((int)uVar8 <
             (int)((ulong)((long)(pvVar4->
                                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar5) >> 3))
    ;
  }
  return (Oop)&NilObject;
}

Assistant:

Oop ASTInterpreter::visitMessageSendNode(MessageSendNode *node)
{
	// Evaluate the receiver.
	node->getReceiver()->acceptVisitor(this);
	auto &chained = node->getChainedMessages();

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
        // Duplicate the receiver for the next chains
        if(i != -1)
            interpreter->popOop();
        if(i + 1 != (int)chained.size())
            interpreter->duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
            arg->acceptVisitor(this);

        interpreter->sendMessageWithSelector(message->getSelectorOop(), (int)arguments.size());
	}

	return Oop();
}